

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_output_model(options_i *options,vw *all)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  long in_RSI;
  option_group_definition *in_RDI;
  option_group_definition output_model_options;
  undefined7 in_stack_ffffffffffffefc8;
  undefined1 in_stack_ffffffffffffefcf;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffefd0;
  string *in_stack_ffffffffffffefd8;
  allocator *paVar4;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff018;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *op
  ;
  option_group_definition *in_stack_fffffffffffff020;
  option_group_definition *this;
  allocator local_ed9;
  string local_ed8 [39];
  allocator local_eb1;
  string local_eb0 [39];
  allocator local_e89;
  string local_e88 [359];
  undefined1 local_d21 [40];
  undefined1 local_cf9 [360];
  allocator local_b91;
  string local_b90 [39];
  allocator local_b69;
  string local_b68 [359];
  allocator local_a01;
  string local_a00 [39];
  allocator local_9d9;
  string local_9d8 [359];
  allocator local_871;
  string local_870 [39];
  allocator local_849;
  string local_848 [359];
  allocator local_6e1;
  string local_6e0 [39];
  allocator local_6b9;
  string local_6b8 [359];
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [359];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [359];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [375];
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [56];
  long local_10;
  option_group_definition *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Output model",&local_69);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffefd0,
             (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"final_regressor",&local_1e1);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffefd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"f",&local_209);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  short_name(in_stack_ffffffffffffefd0,
             (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"Final regressor",&local_231);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffefd0,
       (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffefd0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"readable_model",&local_399);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffefd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3c0,"Output human-readable final regressor with numeric features",&local_3c1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffefd0,
       (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffefd0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"invert_hash",&local_529);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffefd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_550,
             "Output human-readable final regressor with feature names.  Computationally expensive."
             ,&local_551);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffefd0,
       (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffefd0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b8,"save_resume",&local_6b9);
  VW::config::make_option<bool>(in_stack_ffffffffffffefd8,(bool *)in_stack_ffffffffffffefd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6e0,"save extra state so learning can be resumed later with new data",&local_6e1)
  ;
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffefd0,
             (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffefd0,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff020,(typed_option<bool> *)in_stack_fffffffffffff018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_848,"preserve_performance_counters",&local_849);
  VW::config::make_option<bool>(in_stack_ffffffffffffefd8,(bool *)in_stack_ffffffffffffefd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_870,"reset performance counters when warmstarting",&local_871);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffefd0,
             (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffefd0,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff020,(typed_option<bool> *)in_stack_fffffffffffff018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d8,"save_per_pass",&local_9d9);
  VW::config::make_option<bool>(in_stack_ffffffffffffefd8,(bool *)in_stack_ffffffffffffefd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a00,"Save the model after every pass over data",&local_a01);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffefd0,
             (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffefd0,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff020,(typed_option<bool> *)in_stack_fffffffffffff018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b68,"output_feature_regularizer_binary",&local_b69);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffefd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b90,"Per feature regularization output file",&local_b91);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffefd0,
       (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffefd0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff020,in_stack_fffffffffffff018);
  this = (option_group_definition *)local_cf9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_cf9 + 1),"output_feature_regularizer_text",(allocator *)this);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffefd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefd0);
  op = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)local_d21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_d21 + 1),"Per feature regularization output file, in text",
             (allocator *)op);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffefd0,
       (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffefd0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::option_group_definition::add<std::__cxx11::string>(this,op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e88,"id",&local_e89);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffefd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_eb0,"User supplied ID embedded into the final regressor",&local_eb1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffefd0,
       (string *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffefd0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  VW::config::option_group_definition::add<std::__cxx11::string>(this,op);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string((string *)(local_d21 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d21);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string((string *)(local_cf9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_cf9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_b90);
  std::allocator<char>::~allocator((allocator<char> *)&local_b91);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_b68);
  std::allocator<char>::~allocator((allocator<char> *)&local_b69);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator((allocator<char> *)&local_871);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefd0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  (*(code *)**(undefined8 **)&local_8->m_name)(local_8,local_48);
  iVar2 = std::__cxx11::string::compare((char *)(local_10 + 0x3570));
  if ((iVar2 != 0) && ((*(byte *)(local_10 + 0x3439) & 1) == 0)) {
    poVar3 = std::operator<<((ostream *)(local_10 + 0xe0),"final_regressor = ");
    poVar3 = std::operator<<(poVar3,(string *)(local_10 + 0x3570));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  paVar4 = &local_ed9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ed8,"invert_hash",paVar4);
  bVar1 = (**(code **)(*(long *)&local_8->m_name + 8))(local_8,local_ed8);
  std::__cxx11::string::~string(local_ed8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
  if ((bVar1 & 1) != 0) {
    *(undefined1 *)(local_10 + 0x3618) = 1;
  }
  VW::config::option_group_definition::~option_group_definition(local_8);
  return;
}

Assistant:

void parse_output_model(options_i& options, vw& all)
{
  option_group_definition output_model_options("Output model");
  output_model_options
      .add(make_option("final_regressor", all.final_regressor_name).short_name("f").help("Final regressor"))
      .add(make_option("readable_model", all.text_regressor_name)
               .help("Output human-readable final regressor with numeric features"))
      .add(make_option("invert_hash", all.inv_hash_regressor_name)
               .help("Output human-readable final regressor with feature names.  Computationally expensive."))
      .add(make_option("save_resume", all.save_resume)
               .help("save extra state so learning can be resumed later with new data"))
      .add(make_option("preserve_performance_counters", all.preserve_performance_counters)
               .help("reset performance counters when warmstarting"))
      .add(make_option("save_per_pass", all.save_per_pass).help("Save the model after every pass over data"))
      .add(make_option("output_feature_regularizer_binary", all.per_feature_regularizer_output)
               .help("Per feature regularization output file"))
      .add(make_option("output_feature_regularizer_text", all.per_feature_regularizer_text)
               .help("Per feature regularization output file, in text"))
      .add(make_option("id", all.id).help("User supplied ID embedded into the final regressor"));
  options.add_and_parse(output_model_options);

  if (all.final_regressor_name.compare("") && !all.quiet)
    all.trace_message << "final_regressor = " << all.final_regressor_name << endl;

  if (options.was_supplied("invert_hash"))
    all.hash_inv = true;

  // Question: This doesn't seem necessary
  // if (options.was_supplied("id") && find(arg.args.begin(), arg.args.end(), "--id") == arg.args.end())
  // {
  //   arg.args.push_back("--id");
  //   arg.args.push_back(arg.vm["id"].as<string>());
  // }
}